

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined8 *puVar12;
  DataKey DVar13;
  int iVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_20c;
  cpp_dec_float<100U,_int,_void> local_1f8;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1a0;
  cpp_dec_float<100U,_int,_void> *local_198;
  pointer local_190;
  cpp_dec_float<100U,_int,_void> local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  int local_48;
  byte local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  DVar13.info = 0;
  DVar13.idx = -1;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  local_190 = (pSVar2->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  iVar14 = (int)((long)(pSVar2->coWeights).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_190 >> 4) *
           -0x33333333;
  if (start < iVar14) {
    pnVar3 = (pSVar2->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_130 = &this->last;
    lVar16 = (long)start;
    lVar15 = lVar16 * 0x50 + 0x48;
    local_20c = -1;
    local_1a0 = this;
    local_198 = &best->m_backend;
    do {
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar15 + -0x48);
      local_1f8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_1f8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar15 + -0x38);
      local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar15 + -0x28);
      local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_1f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar15 + -0x18);
      local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_1f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_1f8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar15 + -8);
      local_1f8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar15 + -4);
      local_1f8._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar15);
      local_188.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_188.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_188.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_188.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_188.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_188.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_188.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_188.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_188.exp = (feastol->m_backend).exp;
      local_188.neg = (feastol->m_backend).neg;
      local_188.fpclass = (feastol->m_backend).fpclass;
      local_188.prec_elem = (feastol->m_backend).prec_elem;
      if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
        local_188.neg = (bool)(local_188.neg ^ 1);
      }
      if ((local_1f8.fpclass != cpp_dec_float_NaN && local_188.fpclass != cpp_dec_float_NaN) &&
         (tol = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(long)iVar14,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_1f8,&local_188), iVar11 < 0)) {
        local_88 = (devexpr  [8])local_1f8.data._M_elems._0_8_;
        auStack_80[0] = local_1f8.data._M_elems[2];
        auStack_80[1] = local_1f8.data._M_elems[3];
        local_78[0] = local_1f8.data._M_elems[4];
        local_78[1] = local_1f8.data._M_elems[5];
        auStack_70[0] = local_1f8.data._M_elems[6];
        auStack_70[1] = local_1f8.data._M_elems[7];
        local_68[0] = local_1f8.data._M_elems[8];
        local_68[1] = local_1f8.data._M_elems[9];
        auStack_60[0] = local_1f8.data._M_elems[10];
        auStack_60[1] = local_1f8.data._M_elems[0xb];
        local_58[0] = local_1f8.data._M_elems[0xc];
        local_58[1] = local_1f8.data._M_elems[0xd];
        auStack_50[0] = local_1f8.data._M_elems[0xe];
        auStack_50[1] = local_1f8.data._M_elems[0xf];
        local_48 = local_1f8.exp;
        local_44 = local_1f8.neg;
        local_40 = local_1f8.fpclass;
        iStack_3c = local_1f8.prec_elem;
        puVar1 = (uint *)((long)&(local_190->m_backend).data + lVar15 + -0x48);
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(local_190->m_backend).data + lVar15 + -0x38);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(local_190->m_backend).data + lVar15 + -0x28);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(local_190->m_backend).data + lVar15 + -0x18);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = *(int *)((long)&(local_190->m_backend).data + lVar15 + -8);
        local_d8.m_backend.neg = *(bool *)((long)&(local_190->m_backend).data + lVar15 + -4);
        local_d8.m_backend._72_8_ = *(undefined8 *)((long)&(local_190->m_backend).data + lVar15);
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_188,local_88,&local_d8,&local_128,tol);
        local_1f8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
        local_1f8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
        local_1f8.data._M_elems[0xe] = local_188.data._M_elems[0xe];
        local_1f8.data._M_elems[0xf] = local_188.data._M_elems[0xf];
        local_1f8.data._M_elems[8] = local_188.data._M_elems[8];
        local_1f8.data._M_elems[9] = local_188.data._M_elems[9];
        local_1f8.data._M_elems[10] = local_188.data._M_elems[10];
        local_1f8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
        local_1f8.data._M_elems[4] = local_188.data._M_elems[4];
        local_1f8.data._M_elems[5] = local_188.data._M_elems[5];
        local_1f8.data._M_elems[6] = local_188.data._M_elems[6];
        local_1f8.data._M_elems[7] = local_188.data._M_elems[7];
        local_1f8.data._M_elems[0] = local_188.data._M_elems[0];
        local_1f8.data._M_elems[1] = local_188.data._M_elems[1];
        local_1f8.data._M_elems[2] = local_188.data._M_elems[2];
        local_1f8.data._M_elems[3] = local_188.data._M_elems[3];
        local_1f8.exp = local_188.exp;
        local_1f8.neg = local_188.neg;
        local_1f8.fpclass = local_188.fpclass;
        local_1f8.prec_elem = local_188.prec_elem;
        if ((local_188.fpclass != cpp_dec_float_NaN) &&
           ((local_198->fpclass != cpp_dec_float_NaN &&
            (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1f8,local_198), 0 < iVar11)))) {
          puVar12 = (undefined8 *)((long)&(local_190->m_backend).data + lVar15);
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 0xc) =
               local_1f8.data._M_elems._48_8_;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 0xe) =
               local_1f8.data._M_elems._56_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 8)
               = local_1f8.data._M_elems._32_8_;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 10) =
               local_1f8.data._M_elems._40_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 4)
               = local_1f8.data._M_elems._16_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 6)
               = local_1f8.data._M_elems._24_8_;
          *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems =
               local_1f8.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_198->data)->data)._M_elems + 2)
               = local_1f8.data._M_elems._8_8_;
          local_198->exp = local_1f8.exp;
          local_198->neg = local_1f8.neg;
          local_198->fpclass = local_1f8.fpclass;
          local_198->prec_elem = local_1f8.prec_elem;
          uVar4 = puVar12[-9];
          uVar5 = puVar12[-8];
          uVar6 = puVar12[-7];
          uVar7 = puVar12[-6];
          uVar8 = puVar12[-5];
          uVar9 = puVar12[-4];
          uVar10 = puVar12[-2];
          *(undefined8 *)((local_130->m_backend).data._M_elems + 0xc) = puVar12[-3];
          *(undefined8 *)((local_130->m_backend).data._M_elems + 0xe) = uVar10;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 8) = uVar8;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 10) = uVar9;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 4) = uVar6;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 6) = uVar7;
          *(undefined8 *)(local_130->m_backend).data._M_elems = uVar4;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 2) = uVar5;
          (local_1a0->last).m_backend.exp = *(int *)(puVar12 + -1);
          (local_1a0->last).m_backend.neg = *(bool *)((long)puVar12 + -4);
          uVar4 = *puVar12;
          (local_1a0->last).m_backend.fpclass = (int)uVar4;
          (local_1a0->last).m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          local_20c = (int)lVar16;
        }
      }
      lVar16 = lVar16 + incr;
      lVar15 = lVar15 + (long)incr * 0x50;
    } while (lVar16 < iVar14);
    DVar13.info = 0;
    DVar13.idx = -1;
    if (-1 < local_20c) {
      DVar13 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId((local_1a0->
                               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thesolver,local_20c);
    }
  }
  return (SPxId)DVar13;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseDim(R& best, R feastol, int start, int incr)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int end = this->thesolver->coWeights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->coTest().dim());

   for(; start < end; start += incr)
   {
      x = cTest[start];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = cpen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}